

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::
       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,fmt::v10::basic_string_view<char>,char[3]>&>
                 (char *begin,char *end,
                 format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *handler)

{
  format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *in_RDX;
  id_adapter *in_RSI;
  long in_RDI;
  bool bVar1;
  char c;
  id_adapter adapter;
  char c_1;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char cVar2;
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  int id;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  id_adapter *handler_00;
  char *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  id_adapter *local_8;
  
  local_8 = (id_adapter *)(in_RDI + 1);
  if (local_8 == in_RSI) {
    format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_error
              ((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    return (char *)in_RSI;
  }
  if (*(char *)&local_8->handler == '}') {
    format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_arg_id
              ((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *)0x30f43e);
    format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_replacement_field
              ((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,(char *)0x30f44f);
  }
  else if (*(char *)&local_8->handler == '{') {
    format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_text
              (in_RDX,(char *)local_8,(char *)(in_RDI + 2));
  }
  else {
    uVar3 = 0;
    bVar1 = local_8 != in_RSI;
    handler_00 = local_8;
    ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffdf,(char (*) [1])0x364eee);
    id = (int)((ulong)in_RDX >> 0x20);
    cVar2 = *(char *)&local_8->handler;
    if ((cVar2 == '}') || (cVar2 == ':')) {
      parse_replacement_field<char,_fmt::v10::detail::format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>_&>
      ::id_adapter::on_auto
                ((id_adapter *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    }
    else {
      local_8 = (id_adapter *)
                do_parse_arg_id<char,fmt::v10::detail::parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,fmt::v10::basic_string_view<char>,char[3]>&>(char_const*,char_const*,fmt::v10::detail::format_string_checker<char,fmt::v10::basic_string_view<char>,char[3]>&)::id_adapter&>
                          ((char *)CONCAT17(bVar1,CONCAT16(cVar2,in_stack_ffffffffffffffd8)),
                           in_stack_ffffffffffffffd0,handler_00);
    }
    if (local_8 == in_RSI) {
      cVar2 = '\0';
    }
    else {
      cVar2 = *(char *)&local_8->handler;
    }
    if (cVar2 == '}') {
      format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_replacement_field
                ((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *)
                 CONCAT17(0x7d,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,(char *)0x30f570
                );
    }
    else {
      if (cVar2 != ':') {
        format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_error
                  ((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *)
                   CONCAT17(cVar2,in_stack_ffffffffffffff90),
                   (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        return (char *)in_RSI;
      }
      local_8 = (id_adapter *)
                format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::
                on_format_specs((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>
                                 *)CONCAT44(in_stack_ffffffffffffffb4,uVar3),id,
                                (char *)CONCAT17(0x3a,in_stack_ffffffffffffffa0),
                                in_stack_ffffffffffffff98);
      if ((local_8 == in_RSI) || (*(char *)&local_8->handler != '}')) {
        format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]>::on_error
                  ((format_string_checker<char,_fmt::v10::basic_string_view<char>,_char[3]> *)
                   CONCAT17(cVar2,in_stack_ffffffffffffff90),
                   (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        return (char *)in_RSI;
      }
    }
  }
  return (char *)((long)&local_8->handler + 1);
}

Assistant:

FMT_CONSTEXPR auto parse_replacement_field(const Char* begin, const Char* end,
                                           Handler&& handler) -> const Char* {
  struct id_adapter {
    Handler& handler;
    int arg_id;

    FMT_CONSTEXPR void on_auto() { arg_id = handler.on_arg_id(); }
    FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
    FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
      arg_id = handler.on_arg_id(id);
    }
  };

  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}